

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnMemoryCopyExpr
          (BinaryReaderInterp *this,Index destmemidx,Index srcmemidx)

{
  Index index;
  Index index_00;
  bool bVar1;
  Location local_118;
  Var local_f8;
  Location local_b0;
  Var local_90;
  Location local_48;
  Enum local_24;
  Index local_20;
  Index local_1c;
  Index srcmemidx_local;
  Index destmemidx_local;
  BinaryReaderInterp *this_local;
  
  local_20 = srcmemidx;
  local_1c = destmemidx;
  _srcmemidx_local = this;
  GetLocation(&local_48,this);
  index_00 = local_1c;
  GetLocation(&local_b0,this);
  Var::Var(&local_90,index_00,&local_b0);
  index = local_20;
  GetLocation(&local_118,this);
  Var::Var(&local_f8,index,&local_118);
  local_24 = (Enum)SharedValidator::OnMemoryCopy(&this->validator_,&local_48,&local_90,&local_f8);
  bVar1 = Failed((Result)local_24);
  Var::~Var(&local_f8);
  Var::~Var(&local_90);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    Istream::Emit(this->istream_,MemoryCopy,local_1c,local_20);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnMemoryCopyExpr(Index destmemidx, Index srcmemidx) {
  CHECK_RESULT(validator_.OnMemoryCopy(GetLocation(),
                                       Var(destmemidx, GetLocation()),
                                       Var(srcmemidx, GetLocation())));
  istream_.Emit(Opcode::MemoryCopy, destmemidx, srcmemidx);
  return Result::Ok;
}